

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O3

void __thiscall IZDeflate::send_bits(IZDeflate *this,int value,int length)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  uVar2 = value << ((byte)this->bi_valid & 0x1f) | this->bi_buf;
  this->bi_buf = uVar2;
  iVar3 = this->bi_valid + length;
  this->bi_valid = iVar3;
  if (0x10 < iVar3) {
    uVar4 = this->out_offset;
    if (this->out_size - 1 <= uVar4) {
      flush_outbuf(this->out_buf,&this->out_offset);
      uVar2 = this->bi_buf;
      uVar4 = this->out_offset;
    }
    this->out_offset = uVar4 + 1;
    this->out_buf[uVar4] = (char)uVar2;
    cVar1 = *(char *)((long)&this->bi_buf + 1);
    uVar2 = this->out_offset;
    this->out_offset = uVar2 + 1;
    this->out_buf[uVar2] = cVar1;
    iVar3 = this->bi_valid + -0x10;
    this->bi_valid = iVar3;
    this->bi_buf = (uint)value >> ((char)length - (char)iVar3 & 0x1fU);
  }
  return;
}

Assistant:

void IZDeflate::send_bits(int value, int length)
    // int value;  /* value to send */
    // int length; /* number of bits */
{
#ifdef DEBUG
    Tracevv((stderr," l %2d v %4x ", length, value));
    Assert(length > 0 && length <= 15, "invalid length");
    bits_sent += (uzoff_t)length;
#endif
    /* If not enough room in bi_buf, use (bi_valid) bits from bi_buf and
     * (Buf_size - bi_valid) bits from value to flush the filled bi_buf,
     * then fill in the rest of (value), leaving (length - (Buf_size-bi_valid))
     * unused bits in bi_buf.
     */
    bi_buf |= (value << bi_valid);
    bi_valid += length;
    if (bi_valid > (int)Buf_size) {
        PUTSHORT(bi_buf);
        bi_valid -= Buf_size;
        bi_buf = (unsigned)value >> (length - bi_valid);
    }
}